

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O1

SQInteger __thiscall SQFuncState::AllocStackPos(SQFuncState *this)

{
  SQUnsignedInteger *pSVar1;
  ulong uVar2;
  ulong uVar3;
  SQLocalVarInfo *pSVar4;
  SQUnsignedInteger SVar5;
  SQObjectPtr local_40;
  SQUnsignedInteger SStack_30;
  SQUnsignedInteger local_28;
  SQUnsignedInteger SStack_20;
  
  uVar2 = (this->_vlocals)._size;
  local_40.super_SQObject._type = OT_NULL;
  local_40.super_SQObject._unVal.pTable = (SQTable *)0x0;
  SStack_30 = 0;
  local_28 = 0;
  SStack_20 = 0;
  uVar3 = (this->_vlocals)._allocated;
  if (uVar3 <= uVar2) {
    SVar5 = 4;
    if (uVar2 * 2 != 0) {
      SVar5 = uVar2 * 2;
    }
    pSVar4 = (SQLocalVarInfo *)sq_vm_realloc((this->_vlocals)._vals,uVar3 * 0x28,SVar5 * 0x28);
    (this->_vlocals)._vals = pSVar4;
    (this->_vlocals)._allocated = SVar5;
  }
  SVar5 = (this->_vlocals)._size;
  (this->_vlocals)._size = SVar5 + 1;
  pSVar4 = (this->_vlocals)._vals + SVar5;
  (pSVar4->_name).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (pSVar4->_name).super_SQObject._type = OT_NULL;
  (pSVar4->_name).super_SQObject._unVal.pTable = (SQTable *)local_40.super_SQObject._unVal;
  (pSVar4->_name).super_SQObject._type = local_40.super_SQObject._type;
  if ((local_40.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &(((pSVar4->_name).super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  pSVar4->_start_op = SStack_30;
  pSVar4->_end_op = local_28;
  pSVar4->_pos = SStack_20;
  SQObjectPtr::~SQObjectPtr(&local_40);
  if ((ulong)this->_stacksize < (this->_vlocals)._size) {
    if (0xff < this->_stacksize) {
      (*this->_errfunc)(this->_errtarget,"internal compiler error: too many locals");
    }
    this->_stacksize = (this->_vlocals)._size;
  }
  return uVar2;
}

Assistant:

SQInteger SQFuncState::AllocStackPos()
{
    SQInteger npos=_vlocals.size();
    _vlocals.push_back(SQLocalVarInfo());
    if(_vlocals.size()>((SQUnsignedInteger)_stacksize)) {
        if(_stacksize>MAX_FUNC_STACKSIZE) Error(_SC("internal compiler error: too many locals"));
        _stacksize=_vlocals.size();
    }
    return npos;
}